

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseRefType(WastParser *this,Type *out_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Enum EVar2;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  Type local_114;
  undefined1 auStack_110 [4];
  Type type;
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string asStack_a8 [32];
  string asStack_88 [32];
  string asStack_68 [32];
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  Type *local_20;
  Type *out_type_local;
  WastParser *this_local;
  
  local_20 = out_type;
  out_type_local = (Type *)this;
  bVar1 = PeekMatch(this,First_Type);
  if (bVar1) {
    Consume((Token *)auStack_110,this);
    local_114 = Token::type((Token *)auStack_110);
    EVar2 = Type::operator_cast_to_Enum(&local_114);
    if ((EVar2 == Anyref) &&
       (bVar1 = Features::reference_types_enabled(&this->options_->features), !bVar1)) {
      format = Type::GetName(&local_114);
      Error(this,0x3f710f,format);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    local_20->enum_ = local_114.enum_;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c8,"funcref",
               (allocator *)((long)&token.field_2.literal_.text.size_ + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_a8,"anyref",(allocator *)((long)&token.field_2.literal_.text.size_ + 6));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_88,"nullref",(allocator *)((long)&token.field_2.literal_.text.size_ + 5));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_68,"exnref",(allocator *)((long)&token.field_2.literal_.text.size_ + 4));
    local_48 = &local_c8;
    local_40 = 4;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.field_2.literal_.text.size_ + 3));
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,(allocator_type *)((long)&token.field_2.literal_.text.size_ + 3));
    this_local._4_4_ = ErrorExpected(this,&local_38,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token.field_2.literal_.text.size_ + 3));
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_148 = local_148 + -1;
      std::__cxx11::string::~string((string *)local_148);
    } while (local_148 != &local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 4));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 5));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseRefType(Type* out_type) {
  WABT_TRACE(ParseRefType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"funcref", "anyref", "nullref", "exnref"});
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::Anyref && !options_->features.reference_types_enabled()) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}